

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

double __thiscall
Fl_Text_Display::measure_proportional_character(Fl_Text_Display *this,char *s,int xPix,int pos)

{
  char cVar1;
  int length;
  int style;
  double dVar2;
  
  if (*s == '\t') {
    dVar2 = col_to_x(this,(double)this->mBuffer->mTabDist);
    return (double)((xPix / (int)dVar2 + 1) * (int)dVar2 - xPix);
  }
  length = fl_utf8len1(*s);
  if (this->mStyleBuffer == (Fl_Text_Buffer *)0x0) {
    style = 0;
  }
  else {
    cVar1 = Fl_Text_Buffer::byte_at(this->mStyleBuffer,pos);
    style = (int)cVar1;
  }
  dVar2 = string_width(this,s,length,style);
  return dVar2;
}

Assistant:

double Fl_Text_Display::measure_proportional_character(const char *s, int xPix, int pos) const {
  IS_UTF8_ALIGNED(s)

  if (*s=='\t') {
    int tab = (int)col_to_x(mBuffer->tab_distance());
    return (((xPix/tab)+1)*tab) - xPix;
  }

  int charLen = fl_utf8len1(*s), style = 0;
  if (mStyleBuffer) {
    style = mStyleBuffer->byte_at(pos);
  }
  return string_width(s, charLen, style);
}